

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

int unix_read(int fd,uchar *buf,size_t size)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int local_28;
  int len;
  int i;
  size_t size_local;
  uchar *buf_local;
  int fd_local;
  
  local_28 = 0;
  while( true ) {
    sVar2 = read(fd,buf + local_28,size - (long)local_28);
    iVar1 = (int)sVar2;
    if (iVar1 == 0) break;
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      if ((*piVar3 != 4) && (piVar3 = __errno_location(), *piVar3 != 0xb)) {
        perror("read");
        return -1;
      }
    }
    else {
      local_28 = iVar1 + local_28;
      if ((long)local_28 == size) break;
    }
  }
  if (iVar1 == 0) {
    return 0;
  }
  return local_28;
}

Assistant:

int unix_read(int fd, unsigned char *buf, size_t size) {
  int i, len = 0;

  while ((i = read(fd, buf + len, size - len))) {
    if (i < 0) {
      if ((errno == EINTR) || (errno == EAGAIN))
        continue;
      else {
        perror("read");
        return -1;
      }
    } else {
      len += i;
      if (len == size)
        break;
    }
  }

  if (i == 0)
    return 0;
  else
    return len;
}